

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

void __thiscall
TTD::TextFormatWriter::WriteNakedString(TextFormatWriter *this,TTString *val,Separator separator)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined7 in_register_00000011;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  bVar1 = IsNullPtrTTString(val);
  if (bVar1) {
    (*(this->super_FileWriter)._vptr_FileWriter[10])(this,0);
    return;
  }
  FileWriter::WriteFormattedCharData<7ul,unsigned_int>
            (&this->super_FileWriter,(char16 (*) [7])L"@%I32u",val->Length);
  uStack_28 = CONCAT26(0x22,(undefined6)uStack_28);
  FileWriter::WriteRawByteBuff_Fixed<char16_t>
            (&this->super_FileWriter,(char16_t *)((long)&uStack_28 + 6));
  FileWriter::WriteRawByteBuff(&this->super_FileWriter,(byte *)val->Contents,(ulong)val->Length * 2)
  ;
  uStack_28._0_6_ = CONCAT24(0x22,(undefined4)uStack_28);
  FileWriter::WriteRawByteBuff_Fixed<char16_t>
            (&this->super_FileWriter,(char16_t *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void TextFormatWriter::WriteNakedString(const TTString& val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(IsNullPtrTTString(val))
        {
            this->WriteNakedNull();
        }
        else
        {
            this->WriteFormattedCharData(_u("@%I32u"), val.Length);

            this->WriteRawChar(_u('\"'));
            this->WriteRawCharBuff(val.Contents, val.Length);
            this->WriteRawChar(_u('\"'));
        }
    }